

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O3

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextRegionComment(Lexer *this)

{
  int iVar1;
  Lexer *in_RSI;
  Error<pfederc::LexerErrorCode> *local_40;
  Position local_38;
  
  nextChar(in_RSI);
  iVar1 = in_RSI->currentChar;
  if ((iVar1 == 0x21) || (iVar1 == 0x2a)) {
    nextRegionCommentDoc(this);
  }
  else {
    do {
      while (iVar1 != 0x2a) {
        if (iVar1 == -1) {
          getCurrentCursor(&local_38,in_RSI);
          local_40 = (Error<pfederc::LexerErrorCode> *)operator_new(0x38);
          local_40->logLevel = LVL_ERROR;
          local_40->err = LEX_ERR_REGION_COMMENT_END;
          (local_40->pos).line = local_38.line;
          (local_40->pos).startIndex = local_38.startIndex;
          (local_40->pos).endIndex = local_38.endIndex;
          (local_40->extraPos).
          super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (local_40->extraPos).
          super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (local_40->extraPos).
          super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          generateError(this,(unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                              *)in_RSI);
          if (local_40 == (Error<pfederc::LexerErrorCode> *)0x0) {
            return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>
                   )(__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>
                     )this;
          }
          std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>::operator()
                    ((default_delete<pfederc::Error<pfederc::LexerErrorCode>_> *)&local_40,local_40)
          ;
          return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
                 (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
                 this;
        }
        nextChar(in_RSI);
        iVar1 = in_RSI->currentChar;
      }
      nextChar(in_RSI);
      iVar1 = in_RSI->currentChar;
    } while (iVar1 != 0x2f);
    nextChar(in_RSI);
    nextToken(this);
  }
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextRegionComment() noexcept {
  nextChar(); // eat *
  if (currentChar == '*' || currentChar == '!')
    return nextRegionCommentDoc();

  while (currentChar != EOF) {
    if (currentChar == '*') {
      nextChar(); // eat *
      if (currentChar == '/') {
        nextChar(); // eat /
        return nextToken();
      }

      continue;
    }

    nextChar();
  }

  return generateError(std::make_unique<LexerError>(LVL_ERROR, LexerErrorCode::LEX_ERR_REGION_COMMENT_END,
    getCurrentCursor()));
}